

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

wchar_t * __thiscall ON_wString::Array(ON_wString *this)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  ON_Internal_Empty_wString *pOVar3;
  
  pwVar1 = this->m_s;
  pOVar3 = &empty_wstring;
  if (pwVar1 != (wchar_t *)0x0) {
    pOVar3 = (ON_Internal_Empty_wString *)(pwVar1 + -3);
  }
  pwVar2 = (wchar_t *)0x0;
  if (0 < (pOVar3->header).string_capacity) {
    pwVar2 = pwVar1;
  }
  return pwVar2;
}

Assistant:

ON_wStringHeader* ON_wString::Header() const
{
  ON_wStringHeader* hdr = (ON_wStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_wstring.header;
  return hdr;
}